

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::Impl::updateFileInfos(Impl *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  key_type_conflict *in_RDI;
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  *unaff_retaddr;
  value_type *file;
  int i;
  FileInfo *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffd8;
  vector<bool,_std::allocator<bool>_> *this_01;
  reference in_stack_ffffffffffffffe0;
  int local_c;
  key_type_conflict *__k;
  
  __k = in_RDI;
  std::
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  ::clear((map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
           *)0x1379ff);
  local_c = 0;
  while( true ) {
    this_01 = (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffe0._M_p;
    sVar2 = std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
            ::size((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                    *)(in_RDI + 0x12));
    if ((int)sVar2 <= local_c) break;
    in_stack_ffffffffffffffe0 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   (this_01,(size_type)in_stack_ffffffffffffffd8);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffe0);
    if (bVar1) {
      this_00 = std::
                vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                ::operator[]((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                              *)(in_RDI + 0x12),(long)local_c);
      in_stack_ffffffffffffffd8 = this_00;
      std::
      map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
      ::operator[](unaff_retaddr,__k);
      FileInfo::operator=(&this_00->info,in_stack_ffffffffffffffb8);
    }
    local_c = local_c + 1;
  }
  return true;
}

Assistant:

bool updateFileInfos() {
        fileInfos.clear();

        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }
            const auto & file = files[i];
            fileInfos[i] = file.info;
        }

        return true;
    }